

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffDomain<0>::tarjan(AllDiffDomain<0> *this,int node)

{
  bool *pbVar1;
  uint uVar2;
  bool bVar3;
  Node *pNVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Node *pNVar9;
  iterator i;
  iterator local_40;
  
  pNVar4 = this->var_nodes;
  pNVar4[node].mark = true;
  iVar7 = this->index;
  this->index = iVar7 + 1;
  pNVar4[node].index = iVar7;
  pNVar4[node].next = this->stack;
  this->stack = node;
  pNVar4[node].scc = -1;
  pNVar4[node].leak = false;
  if (node < this->sz) {
    local_40.var = this->x[node].var;
    local_40.val = ((local_40.var)->min).v;
    do {
      iVar7 = local_40.val;
      IntVar::iterator::operator++(&local_40);
      pNVar4 = this->val_nodes;
      lVar5 = (long)iVar7;
      if (pNVar4[lVar5].mark == false) {
        bVar3 = tarjan(this,this->sz + iVar7);
        if (!bVar3) {
          return false;
        }
        pNVar4 = this->val_nodes;
      }
      if (pNVar4[lVar5].scc < 0) {
        iVar7 = this->var_nodes[node].index;
        if (pNVar4[lVar5].index < iVar7) {
          iVar7 = pNVar4[lVar5].index;
        }
        this->var_nodes[node].index = iVar7;
      }
      else if (pNVar4[lVar5].leak == false) {
        bVar3 = prune(this,node,iVar7);
        if (!bVar3) {
          return false;
        }
        pNVar4 = this->val_nodes;
      }
      pbVar1 = &this->var_nodes[node].leak;
      *pbVar1 = (bool)(*pbVar1 | pNVar4[lVar5].leak);
    } while( true );
  }
  iVar6 = pNVar4[node].match.v;
  lVar5 = (long)iVar6;
  if (lVar5 < 0) {
    pNVar4[node].leak = true;
  }
  else {
    if (pNVar4[lVar5].mark == false) {
      bVar3 = tarjan(this,iVar6);
      if (!bVar3) {
        return false;
      }
      pNVar4 = this->var_nodes;
    }
    if (pNVar4[lVar5].scc < 0) {
      iVar6 = pNVar4[node].index;
      if (pNVar4[lVar5].index < pNVar4[node].index) {
        iVar6 = pNVar4[lVar5].index;
      }
      pNVar4[node].index = iVar6;
    }
    pNVar4[node].leak = (bool)(pNVar4[node].leak | pNVar4[lVar5].leak);
  }
  if (iVar7 <= pNVar4[node].index) {
    pNVar9 = pNVar4 + node;
    bVar3 = pNVar9->leak;
    uVar2 = this->stack;
    this->stack = pNVar9->next;
    pNVar9->next = -1;
    for (uVar8 = uVar2; -1 < (int)uVar8; uVar8 = pNVar4[uVar8].next) {
      pNVar4[uVar8].leak = bVar3;
      pNVar4[uVar8].scc = uVar2;
    }
  }
  return true;
}

Assistant:

bool tarjan(int node) {
		var_nodes[node].mark = true;

		const int index_save = index++;
		var_nodes[node].index = index_save;

		var_nodes[node].next = stack;
		stack = node;
		var_nodes[node].scc = -1;  // means stacked

		var_nodes[node].leak = false;
		if (node < sz) {
			// visiting var node
			for (typename IntView<U>::iterator i = x[node].begin(); i != x[node].end();) {
				const int val = *i++;
				if (!val_nodes[val].mark && !tarjan(sz + val)) {
					return false;
				}
				if (val_nodes[val].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, val_nodes[val].index);
				} else if (!val_nodes[val].leak && !prune(node, val)) {
					return false;
				}
				var_nodes[node].leak |= val_nodes[val].leak;
			}
		} else {
			// visiting val node
			const int var = var_nodes[node].match;
			if (var < 0) {
				var_nodes[node].leak = true;  // unassigned value
			} else {
				if (!var_nodes[var].mark && !tarjan(var)) {
					return false;
				}
				if (var_nodes[var].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, var_nodes[var].index);
				}
				var_nodes[node].leak |= var_nodes[var].leak;
			}
		}

		if (var_nodes[node].index >= index_save) {  // node is SCC-root
			const int leak = static_cast<int>(var_nodes[node].leak);
			const int scc = stack;
			stack = var_nodes[node].next;
			var_nodes[node].next = -1;

			// fprintf(stderr, "leak %d\n", leak);
			for (int i = scc; i >= 0; i = var_nodes[i].next) {
				assert(var_nodes[i].mark);
				var_nodes[i].leak = (leak != 0);  // propagate through SCC
				var_nodes[i].scc = scc;           // propagate through SCC
																					// if (i < sz)
																					//  fprintf(stderr, "  var %d\n", i);
																					// else
																					//  fprintf(stderr, "  val %d\n", i - sz);
			}
		}
		return true;
	}